

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_rff.cpp
# Opt level: O0

FResourceFile * CheckRFF(char *filename,FileReader *file,bool quiet)

{
  uint uVar1;
  long lVar2;
  FRFFFile *this;
  FResourceFile *rf;
  char head [4];
  FileReader *pFStack_20;
  bool quiet_local;
  FileReader *file_local;
  char *filename_local;
  
  rf._7_1_ = quiet;
  pFStack_20 = file;
  lVar2 = FileReader::GetLength(file);
  if (0xf < lVar2) {
    (*(pFStack_20->super_FileReaderBase)._vptr_FileReaderBase[4])(pFStack_20,0,0);
    (*(pFStack_20->super_FileReaderBase)._vptr_FileReaderBase[2])(pFStack_20,(long)&rf + 3,4);
    (*(pFStack_20->super_FileReaderBase)._vptr_FileReaderBase[4])(pFStack_20,0,0);
    if (rf._3_4_ == 0x1a464652) {
      this = (FRFFFile *)operator_new(0x28);
      FRFFFile::FRFFFile(this,filename,pFStack_20);
      uVar1 = (*(this->super_FResourceFile)._vptr_FResourceFile[3])(this,(ulong)rf._7_1_ & 1);
      if ((uVar1 & 1) != 0) {
        return &this->super_FResourceFile;
      }
      (this->super_FResourceFile).Reader = (FileReader *)0x0;
      if (this != (FRFFFile *)0x0) {
        (*(this->super_FResourceFile)._vptr_FResourceFile[1])();
      }
    }
  }
  return (FResourceFile *)0x0;
}

Assistant:

FResourceFile *CheckRFF(const char *filename, FileReader *file, bool quiet)
{
	char head[4];

	if (file->GetLength() >= 16)
	{
		file->Seek(0, SEEK_SET);
		file->Read(&head, 4);
		file->Seek(0, SEEK_SET);
		if (!memcmp(head, "RFF\x1a", 4))
		{
			FResourceFile *rf = new FRFFFile(filename, file);
			if (rf->Open(quiet)) return rf;

			rf->Reader = NULL; // to avoid destruction of reader
			delete rf;
		}
	}
	return NULL;
}